

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O0

void CompiledMixedType<int,unsigned_int>(void)

{
  uint u2;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> st2;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> su;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> st;
  bool b;
  int t;
  uint u;
  undefined4 in_stack_fffffffffffffe48;
  uint in_stack_fffffffffffffe4c;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
  in_stack_fffffffffffffe50;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
  in_stack_fffffffffffffe54;
  undefined4 in_stack_fffffffffffffe58;
  uint in_stack_fffffffffffffe5c;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
  in_stack_fffffffffffffe60;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
  in_stack_fffffffffffffe64;
  int local_18;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_14;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_10;
  byte local_9;
  int local_8;
  uint local_4;
  
  local_4 = 0;
  local_8 = 0;
  local_9 = 0;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<unsigned_int>
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int),
             (uint *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
            (&local_14,&local_4);
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<unsigned_int>
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe64.m_int,in_stack_fffffffffffffe60.m_int),
             (SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  local_9 = (local_9 ^ 0xff) & 1;
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe64.m_int,in_stack_fffffffffffffe60.m_int),
             (int *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe64.m_int,in_stack_fffffffffffffe60.m_int),
             (uint *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int),
             (SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  local_10.m_int = local_18;
  SafeInt::operator_cast_to_unsigned_int
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),0);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int));
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
             (SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
             in_stack_fffffffffffffe60.m_int);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int));
  operator*(in_stack_fffffffffffffe4c,
            (SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
            in_stack_fffffffffffffe50.m_int);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int),
             in_stack_fffffffffffffe4c);
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),in_stack_fffffffffffffe54
            );
  local_4 = 1;
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe64.m_int,in_stack_fffffffffffffe60.m_int),
             (int *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe64.m_int,in_stack_fffffffffffffe60.m_int),
             (int *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),0);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe64.m_int,in_stack_fffffffffffffe60.m_int),
             (int *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
             (SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
             in_stack_fffffffffffffe60.m_int);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int),
             in_stack_fffffffffffffe4c);
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),in_stack_fffffffffffffe64
            );
  local_4 = 1;
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe64.m_int,in_stack_fffffffffffffe60.m_int),
             (int *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe64.m_int,in_stack_fffffffffffffe60.m_int),
             (int *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),0);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int));
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
             (SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
             in_stack_fffffffffffffe60.m_int);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int));
  operator/(in_stack_fffffffffffffe5c,
            (SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
            in_stack_fffffffffffffe60.m_int);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int),
             in_stack_fffffffffffffe4c);
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),in_stack_fffffffffffffe64
            );
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),0);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int));
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
             (SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
             in_stack_fffffffffffffe60.m_int);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int));
  operator+(in_stack_fffffffffffffe4c,
            (SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
            in_stack_fffffffffffffe50.m_int);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int),
             in_stack_fffffffffffffe4c);
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),in_stack_fffffffffffffe64
            );
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe64.m_int,in_stack_fffffffffffffe60.m_int),
             (int *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  local_4 = 0;
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe64.m_int,in_stack_fffffffffffffe60.m_int),
             (int *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),0);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int));
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
             (SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
             in_stack_fffffffffffffe60.m_int);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int));
  operator-(in_stack_fffffffffffffe4c,
            (SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
            in_stack_fffffffffffffe50.m_int);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int),
             in_stack_fffffffffffffe4c);
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe64.m_int,in_stack_fffffffffffffe60.m_int),
             (int *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe64.m_int,in_stack_fffffffffffffe60.m_int),
             (int *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),in_stack_fffffffffffffe64
            );
  local_4 = 1;
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe64.m_int,in_stack_fffffffffffffe60.m_int),
             (int *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
             in_stack_fffffffffffffe54.m_int);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),in_stack_fffffffffffffe60
            );
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int));
  operator<<(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe50);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int),
             in_stack_fffffffffffffe4c);
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),in_stack_fffffffffffffe54
            );
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
             in_stack_fffffffffffffe54.m_int);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),in_stack_fffffffffffffe60
            );
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int));
  operator>>(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe50);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int),
             in_stack_fffffffffffffe4c);
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),in_stack_fffffffffffffe54
            );
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator&
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
             (SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
             in_stack_fffffffffffffe50.m_int);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator&
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),0);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int));
  operator&(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe50);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT44(in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int))
  ;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator&=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
             (SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
             in_stack_fffffffffffffe54.m_int);
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator&=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int),
             in_stack_fffffffffffffe4c);
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator&=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),in_stack_fffffffffffffe64
            );
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator|
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
             (SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
             in_stack_fffffffffffffe50.m_int);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator|
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),0);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int));
  operator|(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe50);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT44(in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int))
  ;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator|=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
             (SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
             in_stack_fffffffffffffe54.m_int);
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator|=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int),
             in_stack_fffffffffffffe4c);
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator|=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),in_stack_fffffffffffffe64
            );
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator^
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
             (SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
             in_stack_fffffffffffffe50.m_int);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int));
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator^
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),0);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int));
  operator^(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe50);
  local_8 = SafeInt::operator_cast_to_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT44(in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int))
  ;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator^=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
             (SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
             in_stack_fffffffffffffe54.m_int);
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator^=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int),
             in_stack_fffffffffffffe4c);
  SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator^=
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),in_stack_fffffffffffffe64
            );
  local_9 = operator<((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                      in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50);
  local_9 = operator<((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                      in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int);
  local_9 = operator<(0x1b5404,(SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                               0x0);
  local_9 = operator<((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                      in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50);
  local_9 = operator<=((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                       in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50);
  local_9 = operator<=((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0,
                       0x1b5480);
  local_9 = operator<=(in_stack_fffffffffffffe50.m_int,
                       (SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                       in_stack_fffffffffffffe54.m_int);
  local_9 = operator<=((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                       in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50);
  local_9 = operator>((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                      in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50);
  local_9 = operator>((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0,
                      0x1b5520);
  local_9 = operator>(in_stack_fffffffffffffe50.m_int,
                      (SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                      in_stack_fffffffffffffe54.m_int);
  local_9 = operator>((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                      in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50);
  local_9 = operator>=((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                       in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50);
  local_9 = operator>=((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                       in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50.m_int);
  local_9 = operator>=(0x1b55e4,(SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                                0x0);
  local_9 = operator>=((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                       in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50);
  local_9 = operator==((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                       in_stack_fffffffffffffe54.m_int,in_stack_fffffffffffffe50);
  local_9 = operator==((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0,
                       0x1b5660);
  local_9 = operator==(0x1b5684,(SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                                0x0);
  operator==(local_10,local_14);
  return;
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}